

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void __thiscall
bioparser::test::BioparserParserTest_Create_Test::~BioparserParserTest_Create_Test
          (BioparserParserTest_Create_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(BioparserParserTest, Create) {
  try {
    auto p = Parser<biosoup::Sequence>::Create<FastaParser>("");
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::Parser::Create] error: unable to open file ");
  }
}